

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_slot_allocator_alloc(ma_slot_allocator *pAllocator,ma_uint64 *pSlot)

{
  ma_result mVar1;
  ma_uint32 i;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  mVar1 = MA_INVALID_ARGS;
  if (pSlot != (ma_uint64 *)0x0 && pAllocator != (ma_slot_allocator *)0x0) {
    bVar8 = true;
    do {
      bVar4 = bVar8;
      uVar3 = pAllocator->capacity;
      if ((uVar3 & 0x1f) != 0 || uVar3 >> 5 != 0) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          while (uVar3 = pAllocator->pGroups[uVar6].bitfield, uVar3 != 0xffffffff) {
            uVar2 = 0;
            lVar7 = lVar5;
            while ((uVar3 >> (uVar2 & 0x1f) & 1) != 0) {
              uVar2 = uVar2 + 1;
              lVar7 = lVar7 + 1;
              if (uVar2 == 0x20) goto LAB_0019047d;
            }
            if (0x1f < uVar2) {
LAB_0019047d:
              __assert_fail("bitOffset < 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                            ,0x1550,
                            "ma_result ma_slot_allocator_alloc(ma_slot_allocator *, ma_uint64 *)");
            }
            LOCK();
            bVar8 = uVar3 == pAllocator->pGroups[uVar6].bitfield;
            if (bVar8) {
              pAllocator->pGroups[uVar6].bitfield = 1 << ((byte)uVar2 & 0x1f) | uVar3;
            }
            UNLOCK();
            if (bVar8) {
              LOCK();
              pAllocator->count = pAllocator->count + 1;
              UNLOCK();
              if (pAllocator->capacity <= (uint)lVar7) {
                return MA_OUT_OF_MEMORY;
              }
              uVar3 = pAllocator->pSlots[lVar7] + 1;
              pAllocator->pSlots[lVar7] = uVar3;
              *pSlot = ((ulong)uVar3 << 0x20) + lVar7;
              return MA_SUCCESS;
            }
          }
          uVar6 = uVar6 + 1;
          uVar3 = pAllocator->capacity;
          lVar5 = lVar5 + 0x20;
        } while (uVar6 < ((uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1f) == 0));
      }
      mVar1 = MA_OUT_OF_MEMORY;
    } while ((pAllocator->count < uVar3) && (bVar8 = false, bVar4));
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_slot_allocator_alloc(ma_slot_allocator* pAllocator, ma_uint64* pSlot)
{
    ma_uint32 iAttempt;
    const ma_uint32 maxAttempts = 2;    /* The number of iterations to perform until returning MA_OUT_OF_MEMORY if no slots can be found. */

    if (pAllocator == NULL || pSlot == NULL) {
        return MA_INVALID_ARGS;
    }

    for (iAttempt = 0; iAttempt < maxAttempts; iAttempt += 1) {
        /* We need to acquire a suitable bitfield first. This is a bitfield that's got an available slot within it. */
        ma_uint32 iGroup;
        for (iGroup = 0; iGroup < ma_slot_allocator_group_capacity(pAllocator); iGroup += 1) {
            /* CAS */
            for (;;) {
                ma_uint32 oldBitfield;
                ma_uint32 newBitfield;
                ma_uint32 bitOffset;

                oldBitfield = c89atomic_load_32(&pAllocator->pGroups[iGroup].bitfield);  /* <-- This copy must happen. The compiler must not optimize this away. */

                /* Fast check to see if anything is available. */
                if (oldBitfield == 0xFFFFFFFF) {
                    break;  /* No available bits in this bitfield. */
                }

                bitOffset = ma_ffs_32(~oldBitfield);
                MA_ASSERT(bitOffset < 32);

                newBitfield = oldBitfield | (1 << bitOffset);

                if (c89atomic_compare_and_swap_32(&pAllocator->pGroups[iGroup].bitfield, oldBitfield, newBitfield) == oldBitfield) {
                    ma_uint32 slotIndex;

                    /* Increment the counter as soon as possible to have other threads report out-of-memory sooner than later. */
                    c89atomic_fetch_add_32(&pAllocator->count, 1);

                    /* The slot index is required for constructing the output value. */
                    slotIndex = (iGroup << 5) + bitOffset;  /* iGroup << 5 = iGroup * 32 */
                    if (slotIndex >= pAllocator->capacity) {
                        return MA_OUT_OF_MEMORY;
                    }

                    /* Increment the reference count before constructing the output value. */
                    pAllocator->pSlots[slotIndex] += 1;

                    /* Construct the output value. */
                    *pSlot = (((ma_uint64)pAllocator->pSlots[slotIndex] << 32) | slotIndex);

                    return MA_SUCCESS;
                }
            }
        }

        /* We weren't able to find a slot. If it's because we've reached our capacity we need to return MA_OUT_OF_MEMORY. Otherwise we need to do another iteration and try again. */
        if (pAllocator->count < pAllocator->capacity) {
            ma_yield();
        } else {
            return MA_OUT_OF_MEMORY;
        }
    }

    /* We couldn't find a slot within the maximum number of attempts. */
    return MA_OUT_OF_MEMORY;
}